

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O0

void __thiscall Block::generate_points(Block *this,size_t n)

{
  float fVar1;
  float fVar2;
  int iVar3;
  reference pfVar4;
  reference pvVar5;
  vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *in_RSI;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_RDI;
  float u;
  float max;
  float min;
  uint j;
  size_t i;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  uint local_1c;
  size_type in_stack_ffffffffffffffe8;
  vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *__n;
  
  Catch::clara::std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>::resize
            (in_RSI,in_stack_ffffffffffffffe8);
  for (__n = (vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *)0x0;
      __n < in_RSI;
      __n = (vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *)
            ((long)&(__n->
                    super__Vector_base<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1)) {
    for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
      pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      fVar1 = *pfVar4;
      pfVar4 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      fVar2 = *pfVar4;
      iVar3 = rand();
      in_stack_ffffffffffffffcc = ((float)(iVar3 % 0x400) / 1024.0) * (fVar2 - fVar1) + fVar1;
      Catch::clara::std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>::
      operator[]((vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *)
                 (in_RDI + 2),(size_type)__n);
      pvVar5 = Catch::clara::std::array<float,_2UL>::operator[]
                         ((array<float,_2UL> *)in_RDI,
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      *pvVar5 = in_stack_ffffffffffffffcc;
    }
  }
  return;
}

Assistant:

void            generate_points(size_t n)
  {
    points.resize(n);
    for (size_t i = 0; i < n; ++i)
      for (unsigned j = 0; j < DIM; ++j)
      {
        float min = domain.min[j];
        float max = domain.max[j];
        float u = float(rand() % 1024) / 1024;
        points[i][j] = min + u * (max - min);
      }
  }